

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int __thiscall
icu_63::PluralRules::select
          (PluralRules *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  FixedDecimal local_60;
  double number_local;
  PluralRules *this_local;
  
  number_local = (double)CONCAT44(in_register_00000034,__nfds);
  this_local = this;
  FixedDecimal::FixedDecimal(&local_60,in_XMM0_Qa);
  select(this,__nfds,(fd_set *)&local_60,__writefds,__exceptfds,__timeout);
  FixedDecimal::~FixedDecimal(&local_60);
  return (int)this;
}

Assistant:

UnicodeString
PluralRules::select(double number) const {
    return select(FixedDecimal(number));
}